

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void advance_array_seg(uint nxtpage)

{
  uint uVar1;
  LispPTR base;
  uint ncellsleft;
  uint nxtpage_local;
  
  uVar1 = ((*Next_Array_word - ((*ArrayFrLst_word & 0xfffff00) >> 8)) + -1) * 0x80 +
          (0x80 - ((*ArrayFrLst_word & 0xff) >> 1));
  if (uVar1 < 4) {
    *ArrayFrLst2_word = *ArrayFrLst_word;
  }
  else {
    base = makefreearrayblock(*ArrayFrLst_word,(DLword)uVar1);
    mergebackward(base);
    *ArrayFrLst2_word = *LeastMDSPage_word << 8;
  }
  *Next_Array_word = nxtpage & 0xfffff;
  *ArrayFrLst_word = (nxtpage & 0xfffff) << 8;
  *ArraySpace2_word = *ArrayFrLst_word;
  return;
}

Assistant:

static void advance_array_seg(unsigned int nxtpage)
/* rare page num */
{
  unsigned int ncellsleft;

/* Called when 8Mb are exhausted,and we want to switch array space
 into the extended area(Secondary space),starting with nextpage.
 We MUST clean up old area first.   */

#ifdef BIGVM
  nxtpage &= 0xFFFFF; /* new VM, limit is 20 bits of page */
#else
  nxtpage &= 0xFFFF; /* for old VM size, limit is 16 bits of page */
#endif

  ncellsleft = (*Next_Array_word - POINTER_PAGE(*ArrayFrLst_word) - 1) * CELLSPER_PAGE +
               (CELLSPER_PAGE - (((*ArrayFrLst_word) & 0xff) >> 1));

  if (ncellsleft >= MINARRAYBLOCKSIZE) {
    mergebackward(makefreearrayblock(*ArrayFrLst_word, ncellsleft));
#ifdef BIGVM
    *ArrayFrLst2_word = (((*LeastMDSPage_word)) << 8);
#else
    *ArrayFrLst2_word = (((*LeastMDSPage_word) & 0xffff) << 8);
#endif
  } else {
    *ArrayFrLst2_word = *ArrayFrLst_word;
  }
#ifdef BIGVM
  *Next_Array_word = nxtpage;
#else
  *Next_Array_word = S_POSITIVE | nxtpage;
#endif
  *ArrayFrLst_word = nxtpage << 8;
  *ArraySpace2_word = *ArrayFrLst_word;

  /* return(S_POSITIVE); making function void as result never used */

}